

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugXML.c
# Opt level: O3

void xmlShellPrintXPathError(int errorType,char *arg)

{
  int iVar1;
  xmlGenericErrorFunc UNRECOVERED_JUMPTABLE;
  xmlGenericErrorFunc *pp_Var2;
  void **ppvVar3;
  char *pcVar4;
  
  pcVar4 = "Result";
  if (arg != (char *)0x0) {
    pcVar4 = arg;
  }
  if (((uint)errorType < 10) && ((0x3fdU >> (errorType & 0x1fU) & 1) != 0)) {
    iVar1 = *(int *)(&DAT_001f0938 + (ulong)(uint)errorType * 4);
    pp_Var2 = __xmlGenericError();
    UNRECOVERED_JUMPTABLE = *pp_Var2;
    ppvVar3 = __xmlGenericErrorContext();
    (*UNRECOVERED_JUMPTABLE)(*ppvVar3,&DAT_001f0938 + iVar1,pcVar4,UNRECOVERED_JUMPTABLE);
    return;
  }
  return;
}

Assistant:

void
xmlShellPrintXPathError(int errorType, const char *arg)
{
    const char *default_arg = "Result";

    if (!arg)
        arg = default_arg;

    switch (errorType) {
        case XPATH_UNDEFINED:
            xmlGenericError(xmlGenericErrorContext,
                            "%s: no such node\n", arg);
            break;

        case XPATH_BOOLEAN:
            xmlGenericError(xmlGenericErrorContext,
                            "%s is a Boolean\n", arg);
            break;
        case XPATH_NUMBER:
            xmlGenericError(xmlGenericErrorContext,
                            "%s is a number\n", arg);
            break;
        case XPATH_STRING:
            xmlGenericError(xmlGenericErrorContext,
                            "%s is a string\n", arg);
            break;
        case XPATH_POINT:
            xmlGenericError(xmlGenericErrorContext,
                            "%s is a point\n", arg);
            break;
        case XPATH_RANGE:
            xmlGenericError(xmlGenericErrorContext,
                            "%s is a range\n", arg);
            break;
        case XPATH_LOCATIONSET:
            xmlGenericError(xmlGenericErrorContext,
                            "%s is a range\n", arg);
            break;
        case XPATH_USERS:
            xmlGenericError(xmlGenericErrorContext,
                            "%s is user-defined\n", arg);
            break;
        case XPATH_XSLT_TREE:
            xmlGenericError(xmlGenericErrorContext,
                            "%s is an XSLT value tree\n", arg);
            break;
    }
#if 0
    xmlGenericError(xmlGenericErrorContext,
                    "Try casting the result string function (xpath builtin)\n",
                    arg);
#endif
}